

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFPrimitiveWriter.cpp
# Opt level: O0

EStatusCode __thiscall
CFFPrimitiveWriter::WriteRealOperand(CFFPrimitiveWriter *this,double inValue,long inFractalLength)

{
  bool bVar1;
  EStatusCode EVar2;
  double dVar3;
  double dVar4;
  bool local_42;
  Byte local_41;
  bool usedFirst;
  double dStack_40;
  Byte buffer;
  double fractalValue;
  double integerValue;
  unsigned_short exponentSize;
  bool plusExponent;
  bool minusExponent;
  long lStack_28;
  bool minusSign;
  long inFractalLength_local;
  double inValue_local;
  CFFPrimitiveWriter *this_local;
  
  integerValue._7_1_ = inValue < 0.0;
  integerValue._6_1_ = 0;
  integerValue._5_1_ = 0;
  integerValue._2_2_ = 0;
  inFractalLength_local = (long)inValue;
  if ((bool)integerValue._7_1_) {
    inFractalLength_local = (long)-inValue;
  }
  lStack_28 = inFractalLength;
  inValue_local = (double)this;
  fractalValue = floor((double)inFractalLength_local);
  dStack_40 = (double)inFractalLength_local - fractalValue;
  if ((dStack_40 != 0.0) || (NAN(dStack_40))) {
    if ((fractalValue == 0.0) && ((!NAN(fractalValue) && (dStack_40 <= 0.001)))) {
      integerValue._6_1_ = 1;
      for (; dStack_40 < 0.1; dStack_40 = dStack_40 * 10.0) {
        integerValue._2_2_ = integerValue._2_2_ + 1;
      }
    }
  }
  else if (((long)fractalValue % 1000 == 0) && (1000.0 <= fractalValue)) {
    integerValue._5_1_ = 1;
    for (; (long)fractalValue % 10 == 0; fractalValue = fractalValue / 10.0) {
      integerValue._2_2_ = integerValue._2_2_ + 1;
    }
  }
  EVar2 = WriteByte(this,'\x1e');
  if (EVar2 == eSuccess) {
    local_41 = '\0';
    if ((integerValue._7_1_ & 1) != 0) {
      local_41 = 0xe0;
    }
    local_42 = (bool)(integerValue._7_1_ & 1);
    if ((fractalValue != 0.0) || (NAN(fractalValue))) {
      EVar2 = WriteIntegerOfReal(this,fractalValue,&local_41,&local_42);
      if (EVar2 != eSuccess) {
        return eFailure;
      }
    }
    else {
      EVar2 = SetOrWriteNibble(this,'\0',&local_41,&local_42);
      if (EVar2 != eSuccess) {
        return eFailure;
      }
    }
    if (((dStack_40 == 0.0) && (!NAN(dStack_40))) || (lStack_28 < 1)) {
LAB_002aeadf:
      if ((integerValue._6_1_ & 1) != 0) {
        EVar2 = SetOrWriteNibble(this,'\f',&local_41,&local_42);
        if (EVar2 != eSuccess) {
          return eFailure;
        }
        EVar2 = WriteIntegerOfReal(this,(double)integerValue._2_2_,&local_41,&local_42);
        if (EVar2 != eSuccess) {
          return eFailure;
        }
      }
      if ((integerValue._5_1_ & 1) != 0) {
        EVar2 = SetOrWriteNibble(this,'\v',&local_41,&local_42);
        if (EVar2 != eSuccess) {
          return eFailure;
        }
        EVar2 = WriteIntegerOfReal(this,(double)integerValue._2_2_,&local_41,&local_42);
        if (EVar2 != eSuccess) {
          return eFailure;
        }
      }
      if ((local_42 & 1U) == 0) {
        this_local._4_4_ = WriteByte(this,0xff);
      }
      else {
        this_local._4_4_ = SetOrWriteNibble(this,'\x0f',&local_41,&local_42);
      }
    }
    else {
      EVar2 = SetOrWriteNibble(this,'\n',&local_41,&local_42);
      if (EVar2 == eSuccess) {
        while( true ) {
          bVar1 = false;
          if ((dStack_40 != 0.0) || (NAN(dStack_40))) {
            bVar1 = 0 < lStack_28;
          }
          if (!bVar1) goto LAB_002aeadf;
          dVar3 = floor(dStack_40 * 10.0);
          EVar2 = SetOrWriteNibble(this,(Byte)(int)dVar3,&local_41,&local_42);
          dVar3 = dStack_40;
          if (EVar2 != eSuccess) break;
          dVar4 = floor(dStack_40 * 10.0);
          dStack_40 = dVar3 * 10.0 + -dVar4;
          lStack_28 = lStack_28 + -1;
        }
        this_local._4_4_ = eFailure;
      }
      else {
        this_local._4_4_ = eFailure;
      }
    }
  }
  else {
    this_local._4_4_ = eFailure;
  }
  return this_local._4_4_;
}

Assistant:

EStatusCode CFFPrimitiveWriter::WriteRealOperand(double inValue,long inFractalLength)
{
	// first, calculate the proper formatting
    
	bool minusSign = inValue < 0;
	bool minusExponent = false;
	bool plusExponent = false;
	unsigned short exponentSize = 0;
    
	if(minusSign)
		inValue = -inValue;
    
	double integerValue = floor(inValue);
	double fractalValue = inValue - integerValue;
    
	if(0 == fractalValue)
	{
		if(long(integerValue) % 1000 == 0 && integerValue >= 1000) // bother only if larger than 1000
		{
			plusExponent = true;
			while(long(integerValue) % 10 == 0)
			{
				++exponentSize;
				integerValue = integerValue / 10;
			}
		}
	}
    else if(0 == integerValue)
	{
		if(fractalValue <= 0.001) // bother only if < 0.001
		{
			minusExponent = true;
			while(fractalValue < 0.1)
			{
				++exponentSize;
				fractalValue = fractalValue * 10;
			}
		}
	}
    
	// now let's get to work
	if(WriteByte(30) != PDFHummus::eSuccess)
		return PDFHummus::eFailure;
    
	// first, take care of minus sign
	Byte buffer = minusSign ? 0xe0 : 0;
	bool usedFirst = minusSign;
    
	// Integer part
	if(integerValue != 0)
	{
	        if(WriteIntegerOfReal(integerValue,buffer,usedFirst) != PDFHummus::eSuccess)
			return PDFHummus::eFailure;
        }
	else
	{
		if(SetOrWriteNibble(0,buffer,usedFirst) != PDFHummus::eSuccess)
			return PDFHummus::eFailure;
	}

	// Fractal part (if there was an integer or not)
	if(fractalValue != 0 && inFractalLength > 0)
	{
		if(SetOrWriteNibble(0xa,buffer,usedFirst) != PDFHummus::eSuccess)
			return PDFHummus::eFailure;

		while(fractalValue != 0 && inFractalLength > 0)
		{
			if(SetOrWriteNibble((Byte)floor(fractalValue * 10),buffer,usedFirst) != PDFHummus::eSuccess)
				return PDFHummus::eFailure;
			fractalValue = fractalValue * 10 - floor(fractalValue * 10);
			--inFractalLength;
		}
	}
    
	// now, if there's any exponent, write it
	if(minusExponent)
	{
		if(SetOrWriteNibble(0xc,buffer,usedFirst) != PDFHummus::eSuccess)
			return PDFHummus::eFailure;
		if(WriteIntegerOfReal(exponentSize,buffer,usedFirst) != PDFHummus::eSuccess)
			return PDFHummus::eFailure;
	}
	if(plusExponent)
	{
		if(SetOrWriteNibble(0xb,buffer,usedFirst) != PDFHummus::eSuccess)
			return PDFHummus::eFailure;
		if(WriteIntegerOfReal(exponentSize,buffer,usedFirst) != PDFHummus::eSuccess)
			return PDFHummus::eFailure;
	}
    
	// final f or ff
	if(usedFirst)
		return SetOrWriteNibble(0xf,buffer,usedFirst);
	else
		return WriteByte(0xff);
    
}